

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O0

int TvCtrlPointDeleteNode(TvDeviceNode *node)

{
  int iVar1;
  uint uVar2;
  int local_24;
  int local_20;
  int var;
  int service;
  int rc;
  TvDeviceNode *node_local;
  
  if (node == (TvDeviceNode *)0x0) {
    SampleUtil_Print("ERROR: TvCtrlPointDeleteNode: Node is empty\n");
    node_local._4_4_ = -1;
  }
  else {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      iVar1 = strcmp((node->device).TvService[local_20].SID,"");
      if (iVar1 != 0) {
        uVar2 = UpnpUnSubscribe(ctrlpt_handle,(node->device).TvService[local_20].SID);
        if (uVar2 == 0) {
          SampleUtil_Print("Unsubscribed from Tv %s EventURL with SID=%s\n",TvServiceName[local_20],
                           (node->device).TvService[local_20].SID);
        }
        else {
          SampleUtil_Print("Error unsubscribing to Tv %s EventURL -- %d\n",TvServiceName[local_20],
                           (ulong)uVar2);
        }
      }
      for (local_24 = 0; local_24 < TvVarCount[local_20]; local_24 = local_24 + 1) {
        if ((node->device).TvService[local_20].VariableStrVal[local_24] != (char *)0x0) {
          free((node->device).TvService[local_20].VariableStrVal[local_24]);
        }
      }
    }
    SampleUtil_StateUpdate((char *)0x0,(char *)0x0,(char *)node,DEVICE_REMOVED);
    free(node);
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

int TvCtrlPointDeleteNode(struct TvDeviceNode *node)
{
	int rc, service, var;

	if (NULL == node) {
		SampleUtil_Print(
			"ERROR: TvCtrlPointDeleteNode: Node is empty\n");
		return TV_ERROR;
	}

	for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
		/*
		   If we have a valid control SID, then unsubscribe
		 */
		if (strcmp(node->device.TvService[service].SID, "") != 0) {
			rc = UpnpUnSubscribe(ctrlpt_handle,
				node->device.TvService[service].SID);
			if (UPNP_E_SUCCESS == rc) {
				SampleUtil_Print("Unsubscribed from Tv %s "
						 "EventURL with SID=%s\n",
					TvServiceName[service],
					node->device.TvService[service].SID);
			} else {
				SampleUtil_Print("Error unsubscribing to Tv %s "
						 "EventURL -- %d\n",
					TvServiceName[service],
					rc);
			}
		}

		for (var = 0; var < TvVarCount[service]; var++) {
			if (node->device.TvService[service]
					.VariableStrVal[var]) {
				free(node->device.TvService[service]
						.VariableStrVal[var]);
			}
		}
	}

	/*Notify New Device Added */
	SampleUtil_StateUpdate(NULL, NULL, node->device.UDN, DEVICE_REMOVED);
	free(node);
	node = NULL;

	return TV_SUCCESS;
}